

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluReverseOrder_old(word *pF,int nVars,int *V2P,int *P2V,int iVarStart)

{
  int iVar1;
  int local_203c;
  int v;
  word pG [1024];
  int iVarStart_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  If_CluCopy((word *)&stack0xffffffffffffdfc8,pF,nVars);
  for (local_203c = iVarStart; local_203c < nVars; local_203c = local_203c + 1) {
    If_CluMoveVar(pF,nVars,V2P,P2V,P2V[iVarStart],(nVars + -1) - (local_203c - iVarStart));
  }
  If_CluReverseOrder((word *)&stack0xffffffffffffdfc8,nVars,(int *)0x0,(int *)0x0,iVarStart);
  iVar1 = If_CluEqual((word *)&stack0xffffffffffffdfc8,pF,nVars);
  if (iVar1 == 0) {
    printf("%d ",(ulong)(uint)nVars);
  }
  return;
}

Assistant:

void If_CluReverseOrder_old( word * pF, int nVars, int * V2P, int * P2V, int iVarStart )
{
    word pG[CLU_WRD_MAX];
    int v;

    If_CluCopy( pG, pF, nVars );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "  ---  " );

    for ( v = iVarStart; v < nVars; v++ )
        If_CluMoveVar( pF, nVars, V2P, P2V, P2V[iVarStart], nVars - 1 - (v - iVarStart) );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "\n" );

//    if ( iVarStart > 0 )
//        return;

    If_CluReverseOrder( pG, nVars, NULL, NULL, iVarStart );
    if ( If_CluEqual( pG, pF, nVars ) )
    {
//        printf( "+" );
    }
    else
    {
/*
        printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pG, nVars ); 
        printf( "\n" );
*/
        printf( "%d ", nVars );
    }
}